

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_teleport.cpp
# Opt level: O1

int AF_AActor_Teleport(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  AActor *thing;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *pcVar4;
  bool bVar5;
  DAngle local_50;
  DVector3 local_48;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      thing = (AActor *)(param->field_0).field_1.a;
      if (thing != (AActor *)0x0) {
        if ((thing->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(thing->super_DThinker).super_DObject._vptr_DObject)(thing);
          (thing->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (thing->super_DThinker).super_DObject.Class;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0045aa3e;
        }
      }
      if (numparam == 1) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          if (numparam < 3) {
            pcVar4 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x01') {
              if (numparam == 3) {
                pcVar4 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  if (numparam < 5) {
                    pcVar4 = "(paramnum) < numparam";
                  }
                  else {
                    if (param[4].field_0.field_3.Type == '\x01') {
                      if (numparam == 5) {
                        pcVar4 = "(paramnum) < numparam";
                      }
                      else {
                        if (param[5].field_0.field_3.Type == '\0') {
                          local_48.X = (double)param[1].field_0.field_1.a;
                          local_48.Y = (double)param[2].field_0.field_1.a;
                          local_48.Z = (double)param[3].field_0.field_1.a;
                          local_50.Degrees = (double)param[4].field_0.field_1.a;
                          bVar5 = P_Teleport(thing,&local_48,&local_50,param[5].field_0.i);
                          if (numret < 1) {
                            iVar2 = 0;
                          }
                          else {
                            if (ret == (VMReturn *)0x0) {
                              __assert_fail("ret != NULL",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                                            ,0xf9,
                                            "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                           );
                            }
                            if (ret->RegType != '\0') {
                              __assert_fail("RegType == REGT_INT",
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                            ,0x13f,"void VMReturn::SetInt(int)");
                            }
                            *(uint *)ret->Location = (uint)bVar5;
                            iVar2 = 1;
                          }
                          return iVar2;
                        }
                        pcVar4 = "param[paramnum].Type == REGT_INT";
                      }
                      __assert_fail(pcVar4,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                                    ,0xf8,
                                    "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
                  }
                  __assert_fail(pcVar4,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                                ,0xf7,
                                "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar4 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                            ,0xf6,
                            "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar4 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                        ,0xf5,
                        "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar4 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                    ,0xf4,
                    "int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_0045aa3e:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_teleport.cpp"
                ,0xf3,"int AF_AActor_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Teleport)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_ANGLE(an);
	PARAM_INT(flags);
	ACTION_RETURN_BOOL(P_Teleport(self, DVector3(x, y, z), an, flags));
}